

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

size_t varint_get_length(uint64_t v)

{
  undefined8 uStack_8;
  
  if (v < 0xfd) {
    uStack_8 = 1;
  }
  else {
    if (0xffff < v) {
      return (ulong)(v >> 0x20 != 0) * 4 + 5;
    }
    uStack_8 = 3;
  }
  return uStack_8;
}

Assistant:

size_t varint_get_length(uint64_t v)
{
    if (v <= VI_MAX_8)
        return sizeof(uint8_t);
    if (v <= VI_MAX_16)
        return sizeof(uint8_t) + sizeof(uint16_t);
    if (v <= VI_MAX_32)
        return sizeof(uint8_t) + sizeof(uint32_t);
    return sizeof(uint8_t) + sizeof(uint64_t);
}